

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O0

void Abc_SclPrintBuffersInt(SC_Man *p,Abc_Obj_t *pObj,int nOffset)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  int local_2c;
  int i;
  Abc_Obj_t *pFanout;
  int nOffset_local;
  Abc_Obj_t *pObj_local;
  SC_Man *p_local;
  
  Abc_SclPrintBuffersOne(p,pObj,nOffset);
  iVar1 = Abc_ObjIsBuffer(pObj);
  if (iVar1 == 0) {
    __assert_fail("Abc_ObjIsBuffer(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclSize.c"
                  ,0x36c,"void Abc_SclPrintBuffersInt(SC_Man *, Abc_Obj_t *, int)");
  }
  for (local_2c = 0; iVar1 = Abc_ObjFanoutNum(pObj), local_2c < iVar1; local_2c = local_2c + 1) {
    pObj_00 = Abc_ObjFanout(pObj,local_2c);
    iVar1 = Abc_ObjIsBuffer(pObj_00);
    if (iVar1 != 0) {
      Abc_SclPrintBuffersInt(p,pObj_00,nOffset + 1);
    }
  }
  return;
}

Assistant:

void Abc_SclPrintBuffersInt( SC_Man * p, Abc_Obj_t * pObj, int nOffset )
{
    Abc_Obj_t * pFanout;
    int i;
    Abc_SclPrintBuffersOne( p, pObj, nOffset );
    assert( Abc_ObjIsBuffer(pObj) );
    Abc_ObjForEachFanout( pObj, pFanout, i )
        if ( Abc_ObjIsBuffer(pFanout) )
            Abc_SclPrintBuffersInt( p, pFanout, nOffset + 1 );
}